

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O1

void __thiscall
TEST_TestForExceptionsInConstructor_ConstructorThrowsAnExceptionAllocatedAsArray_Test::testBody
          (TEST_TestForExceptionsInConstructor_ConstructorThrowsAnExceptionAllocatedAsArray_Test
           *this)

{
  ClassThatThrowsAnExceptionInTheConstructor *this_00;
  SimpleString failure_msg;
  SimpleString aSStack_38 [2];
  
  SimpleString::SimpleString(aSStack_38,"expected to throw int\nbut threw nothing");
  this_00 = (ClassThatThrowsAnExceptionInTheConstructor *)
            operator_new__(10,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryOperatorOverloadTest.cpp"
                           ,0x184);
  ClassThatThrowsAnExceptionInTheConstructor::ClassThatThrowsAnExceptionInTheConstructor(this_00);
}

Assistant:

TEST(TestForExceptionsInConstructor,ConstructorThrowsAnExceptionAllocatedAsArray)
{
    CHECK_THROWS(int, new ClassThatThrowsAnExceptionInTheConstructor[10]);
}